

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

QAMList * __thiscall
OSTEI_HRR_Algorithm_Base::GenerateAMReq(OSTEI_HRR_Algorithm_Base *this,QAM *am,RRStepType rrstep)

{
  int l;
  int *piVar1;
  undefined4 in_ECX;
  long in_RDX;
  QAMList *in_RDI;
  QAMList *req;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  int k;
  undefined8 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  int iVar2;
  string local_2b0 [80];
  string local_260 [80];
  string local_210 [80];
  string local_1c0 [80];
  string local_170 [80];
  string local_120 [80];
  string local_d0 [80];
  string local_80 [99];
  undefined1 local_1d;
  undefined4 local_1c;
  
  local_1d = 0;
  local_1c = in_ECX;
  std::vector<QAM,_std::allocator<QAM>_>::vector((vector<QAM,_std::allocator<QAM>_> *)0x1353de);
  switch(local_1c) {
  case 0:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    std::__cxx11::string::string(local_80,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(int)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x135537);
    std::__cxx11::string::~string(local_80);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    std::__cxx11::string::string(local_d0,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(int)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x13566a);
    std::__cxx11::string::~string(local_d0);
    break;
  case 1:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    std::__cxx11::string::string(local_120,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(int)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x13584f);
    std::__cxx11::string::~string(local_120);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    std::__cxx11::string::string(local_170,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(int)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x135982);
    std::__cxx11::string::~string(local_170);
    break;
  case 2:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    std::__cxx11::string::string(local_1c0,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(int)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x135b4e);
    std::__cxx11::string::~string(local_1c0);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    std::__cxx11::string::string(local_210,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(int)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x135c75);
    std::__cxx11::string::~string(local_210);
    break;
  case 3:
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    std::__cxx11::string::string(local_260,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),(int)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x135e11);
    std::__cxx11::string::~string(local_260);
    QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb6c);
    piVar1 = QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                             in_stack_fffffffffffffb6c);
    iVar2 = *piVar1;
    piVar1 = QAM::operator[]((QAM *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                             in_stack_fffffffffffffb6c);
    k = *piVar1;
    piVar1 = QAM::operator[]((QAM *)CONCAT44(k,in_stack_fffffffffffffb70),in_stack_fffffffffffffb6c)
    ;
    l = *piVar1 + -1;
    std::__cxx11::string::string(local_2b0,(string *)(in_RDX + 0x10));
    QAM::QAM((QAM *)CONCAT44(iVar2,in_stack_fffffffffffffb80),(int)((ulong)piVar1 >> 0x20),
             (int)piVar1,k,l,(string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
            );
    std::vector<QAM,_std::allocator<QAM>_>::push_back
              ((vector<QAM,_std::allocator<QAM>_> *)CONCAT44(k,l),
               (value_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QAM::~QAM((QAM *)0x135f14);
    std::__cxx11::string::~string(local_2b0);
  }
  return in_RDI;
}

Assistant:

QAMList OSTEI_HRR_Algorithm_Base::GenerateAMReq(QAM am, RRStepType rrstep) const
{
    QAMList req;
    switch(rrstep)
    {
        case RRStepType::I:
            req.push_back({am[0]-1, am[1]+1, am[2]  , am[3]  , am.tag });
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]  , am.tag });
            break;
        case RRStepType::J:
            req.push_back({am[0]+1, am[1]-1, am[2]  , am[3]  , am.tag });
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]  , am.tag });
            break;
        case RRStepType::K:
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]+1, am.tag});
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]  , am.tag});
            break;
        case RRStepType::L:
            req.push_back({am[0]  , am[1]  , am[2]+1, am[3]-1, am.tag});
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-1, am.tag});
            break;
    }

    return req;
}